

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_dce8de::TransitiveLinkImpl::Compute(TransitiveLinkImpl *this)

{
  cmLinkImplementation *this_00;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_a0;
  const_iterator local_98;
  TransitiveLinkImpl *local_90;
  cmLinkImplItem *local_88;
  __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_80;
  __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_78;
  const_iterator local_70;
  cmLinkImplItem *local_68;
  cmLinkImplItem *item;
  iterator __end1;
  iterator __begin1;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  undefined1 local_28 [8];
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> original;
  TransitiveLinkImpl *this_local;
  
  original.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::vector
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_28,
             (vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this->Impl);
  __first = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::cbegin
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_28);
  __last = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::cend
                     ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_28);
  std::set<cmLinkItem,std::less<cmLinkItem>,std::allocator<cmLinkItem>>::
  insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>>
            ((set<cmLinkItem,std::less<cmLinkItem>,std::allocator<cmLinkItem>> *)&this->Emitted,
             (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
              )__first._M_current,
             (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
              )__last._M_current);
  __end1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                     ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_28);
  item = (cmLinkImplItem *)
         std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                   ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                *)&item);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator*(&__end1);
    Follow(this,(local_68->super_cmLinkItem).Target);
    std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
              ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this->Impl,local_68);
    __gnu_cxx::
    __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&__end1);
  }
  this_00 = this->Impl;
  local_80._M_current =
       (cmLinkImplItem *)
       std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                 ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
  local_88 = (cmLinkImplItem *)
             std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                       ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this->Impl);
  local_90 = this;
  local_78 = std::
             remove_if<__gnu_cxx::__normal_iterator<cmLinkImplItem*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0>
                       (local_80,(__normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                  )local_88,(anon_class_8_1_8991fb9c_for__M_pred)this);
  __gnu_cxx::
  __normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
  ::__normal_iterator<cmLinkImplItem*>
            ((__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
              *)&local_70,&local_78);
  local_a0._M_current =
       (cmLinkImplItem *)
       std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                 ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this->Impl);
  __gnu_cxx::
  __normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
  ::__normal_iterator<cmLinkImplItem*>
            ((__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
              *)&local_98,&local_a0);
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::erase
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00,local_70,local_98);
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_28);
  return;
}

Assistant:

void TransitiveLinkImpl::Compute()
{
  // Save the original items and start with an empty list.
  std::vector<cmLinkImplItem> original = std::move(this->Impl.Libraries);

  // Avoid injecting any original items as usage requirements.
  // This gives LINK_LIBRARIES final control over the order
  // if it explicitly lists everything.
  this->Emitted.insert(original.cbegin(), original.cend());

  // Process each original item.
  for (cmLinkImplItem& item : original) {
    // Inject direct dependencies listed in 'INTERFACE_LINK_LIBRARIES_DIRECT'
    // usage requirements before the item itself.
    this->Follow(item.Target);

    // Add the item itself.
    this->Impl.Libraries.emplace_back(std::move(item));
  }

  // Remove items listed in 'INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE'
  // usage requirements found through any dependency above.
  this->Impl.Libraries.erase(
    std::remove_if(this->Impl.Libraries.begin(), this->Impl.Libraries.end(),
                   [this](cmLinkImplItem const& item) {
                     return this->Excluded.find(item) != this->Excluded.end();
                   }),
    this->Impl.Libraries.end());
}